

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

MPEG2VideoDescriptor * __thiscall
ASDCP::MXF::MPEG2VideoDescriptor::InitFromTLVSet(MPEG2VideoDescriptor *this,TLVReader *TLVSet)

{
  bool bVar1;
  int iVar2;
  MDDEntry *pMVar3;
  MDDEntry *pMVar4;
  MDDEntry *in_RDX;
  TLVReader local_448;
  TLVReader local_3e0;
  TLVReader local_378;
  TLVReader local_310;
  TLVReader local_2a8;
  TLVReader local_240;
  TLVReader local_1d8;
  TLVReader local_170;
  TLVReader local_108;
  TLVReader local_a0;
  undefined1 local_21;
  MDDEntry *local_20;
  TLVReader *TLVSet_local;
  MPEG2VideoDescriptor *this_local;
  Result_t *result;
  
  TLVSet_local = TLVSet;
  this_local = this;
  if (TLVSet[1].super_MemIOReader.m_p == (byte_t *)0x0) {
    __assert_fail("m_Dict",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                  ,0xa14,
                  "virtual ASDCP::Result_t ASDCP::MXF::MPEG2VideoDescriptor::InitFromTLVSet(TLVReader &)"
                 );
  }
  local_21 = 0;
  local_20 = in_RDX;
  CDCIEssenceDescriptor::InitFromTLVSet(&this->super_CDCIEssenceDescriptor,TLVSet);
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_MPEG2VideoDescriptor_SingleSequence);
    optional_property<unsigned_char>::get((optional_property<unsigned_char> *)&TLVSet[0xc].m_Lookup)
    ;
    TLVReader::ReadUi8(&local_a0,pMVar4,pMVar3->ul);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_a0);
    Kumu::Result_t::~Result_t((Result_t *)&local_a0);
    bVar1 = Kumu::Result_t::operator==((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
    optional_property<unsigned_char>::set_has_value
              ((optional_property<unsigned_char> *)&TLVSet[0xc].m_Lookup,bVar1);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_MPEG2VideoDescriptor_ConstantBFrames);
    optional_property<unsigned_char>::get
              ((optional_property<unsigned_char> *)((long)&TLVSet[0xc].m_Lookup + 2));
    TLVReader::ReadUi8(&local_108,pMVar4,pMVar3->ul);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_108);
    Kumu::Result_t::~Result_t((Result_t *)&local_108);
    bVar1 = Kumu::Result_t::operator==((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
    optional_property<unsigned_char>::set_has_value
              ((optional_property<unsigned_char> *)((long)&TLVSet[0xc].m_Lookup + 2),bVar1);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_MPEG2VideoDescriptor_CodedContentType);
    optional_property<unsigned_char>::get
              ((optional_property<unsigned_char> *)((long)&TLVSet[0xc].m_Lookup + 4));
    TLVReader::ReadUi8(&local_170,pMVar4,pMVar3->ul);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_170);
    Kumu::Result_t::~Result_t((Result_t *)&local_170);
    bVar1 = Kumu::Result_t::operator==((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
    optional_property<unsigned_char>::set_has_value
              ((optional_property<unsigned_char> *)((long)&TLVSet[0xc].m_Lookup + 4),bVar1);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_MPEG2VideoDescriptor_LowDelay);
    optional_property<unsigned_char>::get
              ((optional_property<unsigned_char> *)((long)&TLVSet[0xc].m_Lookup + 6));
    TLVReader::ReadUi8(&local_1d8,pMVar4,pMVar3->ul);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_1d8);
    Kumu::Result_t::~Result_t((Result_t *)&local_1d8);
    bVar1 = Kumu::Result_t::operator==((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
    optional_property<unsigned_char>::set_has_value
              ((optional_property<unsigned_char> *)((long)&TLVSet[0xc].m_Lookup + 6),bVar1);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_MPEG2VideoDescriptor_ClosedGOP);
    optional_property<unsigned_char>::get((optional_property<unsigned_char> *)(TLVSet + 0xd));
    TLVReader::ReadUi8(&local_240,pMVar4,pMVar3->ul);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_240);
    Kumu::Result_t::~Result_t((Result_t *)&local_240);
    bVar1 = Kumu::Result_t::operator==((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
    optional_property<unsigned_char>::set_has_value
              ((optional_property<unsigned_char> *)(TLVSet + 0xd),bVar1);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_MPEG2VideoDescriptor_IdenticalGOP);
    optional_property<unsigned_char>::get
              ((optional_property<unsigned_char> *)((long)&TLVSet[0xd].super_MemIOReader.m_p + 2));
    TLVReader::ReadUi8(&local_2a8,pMVar4,pMVar3->ul);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_2a8);
    Kumu::Result_t::~Result_t((Result_t *)&local_2a8);
    bVar1 = Kumu::Result_t::operator==((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
    optional_property<unsigned_char>::set_has_value
              ((optional_property<unsigned_char> *)((long)&TLVSet[0xd].super_MemIOReader.m_p + 2),
               bVar1);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_MPEG2VideoDescriptor_MaxGOP);
    optional_property<unsigned_char>::get
              ((optional_property<unsigned_char> *)((long)&TLVSet[0xd].super_MemIOReader.m_p + 4));
    TLVReader::ReadUi8(&local_310,pMVar4,pMVar3->ul);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_310);
    Kumu::Result_t::~Result_t((Result_t *)&local_310);
    bVar1 = Kumu::Result_t::operator==((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
    optional_property<unsigned_char>::set_has_value
              ((optional_property<unsigned_char> *)((long)&TLVSet[0xd].super_MemIOReader.m_p + 4),
               bVar1);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_MPEG2VideoDescriptor_BPictureCount);
    optional_property<unsigned_char>::get
              ((optional_property<unsigned_char> *)((long)&TLVSet[0xd].super_MemIOReader.m_p + 6));
    TLVReader::ReadUi8(&local_378,pMVar4,pMVar3->ul);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_378);
    Kumu::Result_t::~Result_t((Result_t *)&local_378);
    bVar1 = Kumu::Result_t::operator==((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
    optional_property<unsigned_char>::set_has_value
              ((optional_property<unsigned_char> *)((long)&TLVSet[0xd].super_MemIOReader.m_p + 6),
               bVar1);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_MPEG2VideoDescriptor_BitRate);
    optional_property<unsigned_int>::get
              ((optional_property<unsigned_int> *)&TLVSet[0xd].super_MemIOReader.m_capacity);
    TLVReader::ReadUi32(&local_3e0,pMVar4,(ui32_t *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_3e0);
    Kumu::Result_t::~Result_t((Result_t *)&local_3e0);
    bVar1 = Kumu::Result_t::operator==((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
    optional_property<unsigned_int>::set_has_value
              ((optional_property<unsigned_int> *)&TLVSet[0xd].super_MemIOReader.m_capacity,bVar1);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if (-1 < iVar2) {
    pMVar4 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_MPEG2VideoDescriptor_ProfileAndLevel);
    optional_property<unsigned_char>::get
              ((optional_property<unsigned_char> *)&TLVSet[0xd].m_ElementMap);
    TLVReader::ReadUi8(&local_448,local_20,pMVar4->ul);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_448);
    Kumu::Result_t::~Result_t((Result_t *)&local_448);
    bVar1 = Kumu::Result_t::operator==((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
    optional_property<unsigned_char>::set_has_value
              ((optional_property<unsigned_char> *)&TLVSet[0xd].m_ElementMap,bVar1);
  }
  return this;
}

Assistant:

ASDCP::Result_t
MPEG2VideoDescriptor::InitFromTLVSet(TLVReader& TLVSet)
{
  assert(m_Dict);
  Result_t result = CDCIEssenceDescriptor::InitFromTLVSet(TLVSet);
  if ( ASDCP_SUCCESS(result) ) { 
    result = TLVSet.ReadUi8(OBJ_READ_ARGS_OPT(MPEG2VideoDescriptor, SingleSequence));
    SingleSequence.set_has_value( result == RESULT_OK );
  }
  if ( ASDCP_SUCCESS(result) ) { 
    result = TLVSet.ReadUi8(OBJ_READ_ARGS_OPT(MPEG2VideoDescriptor, ConstantBFrames));
    ConstantBFrames.set_has_value( result == RESULT_OK );
  }
  if ( ASDCP_SUCCESS(result) ) { 
    result = TLVSet.ReadUi8(OBJ_READ_ARGS_OPT(MPEG2VideoDescriptor, CodedContentType));
    CodedContentType.set_has_value( result == RESULT_OK );
  }
  if ( ASDCP_SUCCESS(result) ) { 
    result = TLVSet.ReadUi8(OBJ_READ_ARGS_OPT(MPEG2VideoDescriptor, LowDelay));
    LowDelay.set_has_value( result == RESULT_OK );
  }
  if ( ASDCP_SUCCESS(result) ) { 
    result = TLVSet.ReadUi8(OBJ_READ_ARGS_OPT(MPEG2VideoDescriptor, ClosedGOP));
    ClosedGOP.set_has_value( result == RESULT_OK );
  }
  if ( ASDCP_SUCCESS(result) ) { 
    result = TLVSet.ReadUi8(OBJ_READ_ARGS_OPT(MPEG2VideoDescriptor, IdenticalGOP));
    IdenticalGOP.set_has_value( result == RESULT_OK );
  }
  if ( ASDCP_SUCCESS(result) ) { 
    result = TLVSet.ReadUi8(OBJ_READ_ARGS_OPT(MPEG2VideoDescriptor, MaxGOP));
    MaxGOP.set_has_value( result == RESULT_OK );
  }
  if ( ASDCP_SUCCESS(result) ) { 
    result = TLVSet.ReadUi8(OBJ_READ_ARGS_OPT(MPEG2VideoDescriptor, BPictureCount));
    BPictureCount.set_has_value( result == RESULT_OK );
  }
  if ( ASDCP_SUCCESS(result) ) { 
    result = TLVSet.ReadUi32(OBJ_READ_ARGS_OPT(MPEG2VideoDescriptor, BitRate));
    BitRate.set_has_value( result == RESULT_OK );
  }
  if ( ASDCP_SUCCESS(result) ) { 
    result = TLVSet.ReadUi8(OBJ_READ_ARGS_OPT(MPEG2VideoDescriptor, ProfileAndLevel));
    ProfileAndLevel.set_has_value( result == RESULT_OK );
  }
  return result;
}